

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,int *value)

{
  pointer begin_00;
  pointer end_00;
  size_t j;
  int *data;
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  int *piVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  size_t j_1;
  size_type __n;
  ulong dimension;
  allocator_type local_179;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  size_t x;
  Geometry<std::allocator<unsigned_long>_> local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  View<int,_false,_std::allocator<unsigned_long>_> view2;
  View<int,_false,_std::allocator<unsigned_long>_> viewT;
  
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = 1;
  for (_Var5._M_current = begin._M_current; _Var5._M_current != end._M_current;
      _Var5._M_current = _Var5._M_current + 1) {
    x = *_Var5._M_current;
    marray_detail::Assert<bool>(x != 0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&newShape,&x);
    __n = __n * x;
  }
  data = __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    data[sVar1] = *value;
  }
  piVar4 = *(int **)this;
  if (piVar4 == (int *)0x0) goto LAB_001ca102;
  if (__n == 1) {
LAB_001ca0eb:
    *data = *piVar4;
  }
  else {
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar2 == 0) {
      piVar4 = *(int **)this;
      goto LAB_001ca0eb;
    }
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&base1,sVar2,(allocator_type *)&x);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&base2,(long)newShape.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)newShape.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&x);
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    x = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&shape1,sVar2,&x,(allocator_type *)&viewT);
    x = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&shape2,(long)newShape.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)newShape.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3,&x,
               (allocator_type *)&viewT);
    dimension = 0;
    while( true ) {
      sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      uVar3 = (long)newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      if (sVar2 <= uVar3) {
        uVar3 = sVar2;
      }
      if (uVar3 <= dimension) break;
      sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this,dimension);
      if (newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[dimension] < sVar2) {
        sVar2 = newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[dimension];
      }
      shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[dimension] = sVar2;
      shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[dimension] = sVar2;
      dimension = dimension + 1;
    }
    View<int,_true,_std::allocator<unsigned_long>_>::View
              ((View<int,_true,_std::allocator<unsigned_long>_> *)&x,(allocator_type *)&viewT);
    View<int,false,std::allocator<unsigned_long>>::
    constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)this,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (View<int,_true,_std::allocator<unsigned_long>_> *)&x);
    end_00 = newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    begin_00 = newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    View<int,false,std::allocator<unsigned_long>>::
    View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)&viewT,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )begin_00,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )end_00,data,(CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
               (allocator_type *)&view2);
    View<int,_false,_std::allocator<unsigned_long>_>::View(&view2,&local_179);
    View<int,false,std::allocator<unsigned_long>>::
    view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)&viewT,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,&view2);
    View<int,_true,_std::allocator<unsigned_long>_>::squeeze
              ((View<int,_true,_std::allocator<unsigned_long>_> *)&x);
    View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&view2);
    View<int,_false,_std::allocator<unsigned_long>_>::operator=
              (&view2,(View<int,_true,_std::allocator<unsigned_long>_> *)&x);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&view2.geometry_);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&viewT.geometry_);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_148);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    piVar4 = *(int **)this;
  }
  operator_delete(piVar4,*(long *)(this + 0x30) << 2);
  *(undefined8 *)this = 0;
LAB_001ca102:
  View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)this,begin,end,data,
             (CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),(allocator_type *)&x)
  ;
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}